

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MicroString::SetString
          (MicroString *this,string *data,Arena *arena,size_t inline_capacity)

{
  size_type sVar1;
  LargeRepKind LVar2;
  ulong uVar3;
  StringRep *pSVar4;
  string_view data_00;
  
  uVar3 = 0x20;
  if (0x20 < inline_capacity) {
    uVar3 = inline_capacity;
  }
  if (data->_M_string_length <= uVar3) {
    data_00._M_str = (data->_M_dataplus)._M_p;
    data_00._M_len = data->_M_string_length;
    SetImpl(this,data_00,arena,inline_capacity);
    return;
  }
  if (((ulong)this->rep_ & 1) != 0) {
    LVar2 = large_rep_kind(this);
    if (LVar2 == kString) {
      pSVar4 = string_rep(this);
      goto LAB_00250f75;
    }
  }
  if ((arena == (Arena *)0x0) && (((ulong)this->rep_ & 3) != 0)) {
    DestroySlow(this);
  }
  pSVar4 = AllocateStringRep(this,arena);
LAB_00250f75:
  std::__cxx11::string::operator=((string *)&pSVar4->str,(string *)data);
  sVar1 = (pSVar4->str)._M_string_length;
  (pSVar4->super_LargeRep).payload = (pSVar4->str)._M_dataplus._M_p;
  (pSVar4->super_LargeRep).size = (uint32_t)sVar1;
  return;
}

Assistant:

void MicroString::SetString(std::string&& data, Arena* arena,
                            size_t inline_capacity) {
  if (data.size() <= std::max(inline_capacity, size_t{32})) {
    // Just copy the data. The overhead of the string is not worth it.
    return Set(data, arena, inline_capacity);
  }

  StringRep* h;
  if (!is_large_rep() || large_rep_kind() != kString) {
    if (arena == nullptr) Destroy();
    h = AllocateStringRep(arena);
  } else {
    h = string_rep();
  }

  h->str = std::move(data);
  h->ResetBase();
}